

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_draw.cpp
# Opt level: O3

void __thiscall Am_Drawonable_Impl::Allocate_Closest_Color(Am_Drawonable_Impl *this,XColor *c)

{
  unsigned_long *puVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  void *pvVar6;
  ostream *poVar7;
  long *plVar8;
  ulong uVar9;
  int iVar10;
  ushort *puVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  int n;
  XVisualInfo vit;
  int local_74;
  undefined1 local_70 [8];
  undefined8 local_68;
  
  iVar4 = XAllocColor(this->screen->display,this->screen->colormap,c);
  if (iVar4 == 0) {
    if (Allocate_Closest_Color(XColor&)::flag == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** No color cells left; using closest match.\n",0x2d);
      Allocate_Closest_Color(XColor&)::flag = '\x01';
    }
    local_68 = XVisualIDFromVisual(*(undefined8 *)
                                    (*(long *)(this->screen->display + 0xe8) + 0x40 +
                                    (long)this->screen->screen_number * 0x80));
    lVar5 = XGetVisualInfo(this->screen->display,1,local_70,&local_74);
    if (local_74 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "** X Error finding closest color match.  Using Black instead.\n",0x3e);
      XFree(lVar5);
      Paint_It_Black(c,this->screen->display,this->screen->colormap);
    }
    else {
      iVar4 = *(int *)(lVar5 + 0x38);
      uVar13 = (ulong)iVar4;
      XFree(lVar5);
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)uVar13) {
        uVar9 = uVar13 << 4;
      }
      pvVar6 = operator_new__(uVar9);
      auVar3 = _DAT_00284090;
      if (0 < (long)uVar13) {
        lVar5 = uVar13 - 1;
        auVar15._8_4_ = (int)lVar5;
        auVar15._0_8_ = lVar5;
        auVar15._12_4_ = (int)((ulong)lVar5 >> 0x20);
        plVar8 = (long *)((long)pvVar6 + 0x10);
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_00284090;
        auVar17 = _DAT_00284a10;
        do {
          auVar20 = auVar17 ^ auVar3;
          if ((bool)(~(auVar20._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar20._0_4_ ||
                      auVar15._4_4_ < auVar20._4_4_) & 1)) {
            plVar8[-2] = uVar9;
          }
          if ((auVar20._12_4_ != auVar15._12_4_ || auVar20._8_4_ <= auVar15._8_4_) &&
              auVar20._12_4_ <= auVar15._12_4_) {
            *plVar8 = uVar9 + 1;
          }
          uVar9 = uVar9 + 2;
          lVar5 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar5 + 2;
          plVar8 = plVar8 + 4;
        } while ((iVar4 + 1U & 0xfffffffe) != uVar9);
      }
      XQueryColors(this->screen->display,this->screen->colormap,pvVar6,iVar4);
      iVar10 = 0;
      if (1 < iVar4) {
        fVar14 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)pvVar6 + 0xc));
        fVar16 = (float)(int)((uint)c->red - (uint)*(ushort *)((long)pvVar6 + 8));
        fVar18 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)pvVar6 + 10));
        puVar11 = (ushort *)((long)pvVar6 + 0x1c);
        uVar9 = 0;
        uVar12 = 1;
        fVar14 = fVar14 * fVar14 + fVar16 * fVar16 + fVar18 * fVar18;
        do {
          fVar16 = (float)(int)((uint)c->red - (uint)puVar11[-2]);
          fVar18 = (float)(int)((uint)c->green - (uint)puVar11[-1]);
          fVar19 = (float)(int)((uint)c->blue - (uint)*puVar11);
          fVar16 = fVar19 * fVar19 + fVar16 * fVar16 + fVar18 * fVar18;
          if (fVar16 < fVar14) {
            uVar9 = uVar12 & 0xffffffff;
          }
          iVar10 = (int)uVar9;
          if (fVar14 <= fVar16) {
            fVar16 = fVar14;
          }
          uVar12 = uVar12 + 1;
          puVar11 = puVar11 + 8;
          fVar14 = fVar16;
        } while (uVar13 != uVar12);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   Wanted r",0xb);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", g",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", b",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"   got    r",0xb);
      lVar5 = (long)iVar10 * 0x10;
      puVar1 = (unsigned_long *)((long)pvVar6 + lVar5);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", g",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,", b",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
      fVar14 = (float)(int)((uint)c->red - (uint)*(ushort *)((long)pvVar6 + lVar5 + 8));
      fVar16 = (float)(int)((uint)c->green - (uint)*(ushort *)((long)pvVar6 + lVar5 + 10));
      fVar18 = (float)(int)((uint)c->blue - (uint)*(ushort *)((long)pvVar6 + lVar5 + 0xc));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  Error = ",10);
      std::ostream::_M_insert<double>((double)(fVar18 * fVar18 + fVar14 * fVar14 + fVar16 * fVar16))
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," error with cell i = ",0x15);
      plVar8 = (long *)std::ostream::operator<<(&std::cerr,iVar10);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
      iVar4 = XAllocColor(this->screen->display,this->screen->colormap,puVar1);
      if (iVar4 == 0) {
        Paint_It_Black(c,this->screen->display,this->screen->colormap);
      }
      else {
        uVar2 = puVar1[1];
        c->pixel = *puVar1;
        c->red = (short)uVar2;
        c->green = (short)(uVar2 >> 0x10);
        c->blue = (short)(uVar2 >> 0x20);
        c->flags = (char)(uVar2 >> 0x30);
        c->pad = (char)(uVar2 >> 0x38);
      }
      operator_delete__(pvVar6);
    }
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Allocate_Closest_Color(XColor &c) const
{
  // if we have a match, do no work.
  if (XAllocColor(screen->display, screen->colormap, &c))
    return;

  static int flag = 0;
  if (!flag) {
    std::cerr << "** No color cells left; using closest match.\n";
    flag = 1;
  }

  // X manual claims that the following 7 or so lines of code are only
  // slightly less convenient than just using "V->colormap_size" which
  // isn't allowed in case they change the Visual structure.  Crap.
  Visual *V = DefaultVisual(screen->display, screen->screen_number);
  VisualID vid = XVisualIDFromVisual(V);
  XVisualInfo vit; // template
  vit.visualid = vid;
  int n;
  XVisualInfo *vi = XGetVisualInfo(screen->display, VisualIDMask, &vit, &n);
  if (n == 0) {
    std::cerr
        << "** X Error finding closest color match.  Using Black instead.\n";
    XFree(vi);
    Paint_It_Black(c, screen->display, screen->colormap);
    return;
  }
  int n_colors = vi->colormap_size;
  XFree(vi);

  int i;
  XColor *colors = new XColor[n_colors];
  // fill the array with pixel values we want the rgb's for.
  for (i = 0; i < n_colors; i++)
    colors[i].pixel = i;
  XQueryColors(screen->display, screen->colormap, colors, n_colors);
#if defined(_M_UNIX)
  float *ecolors = new float[n_colors];
  // Compute error colors for color table
  for (i = 0; i < n_colors; i++)
    ecolors[i] = color_error(c.red, colors[i].red, c.green, colors[i].green,
                             c.blue, colors[i].blue);
  // Sort array by base in error color
  for (i = 0; i < n_colors; i++) {
    int j;
    for (j = i + 1; j < n_colors; j++)
      if (ecolors[i] > ecolors[j]) {
        float t = ecolors[i];
        ecolors[i] = ecolors[j];
        ecolors[j] = t;
        XColor ct = colors[i];
        colors[i] = colors[j];
        colors[j] = ct;
      }
    if (XAllocColor(screen->display, screen->colormap, &colors[i])) {
      c = colors[i];
      delete[] ecolors;
      delete[] colors;
      return;
    }
  }
  Paint_It_Black(c, screen->display, screen->colormap);
  delete[] ecolors;
  delete[] colors;
#else
  float e;
  int index_of_min = 0;
  float min_error =
      color_error(c.red, colors[0].red, c.green, colors[0].green, c.blue,
                  colors[0].blue); // so we don't recalculate
  for (i = 1; i < n_colors; i++) { // skip cell 0: default values.
    e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                    colors[i].blue);
    if (e < min_error) {
      index_of_min = i;
      min_error = e;
    }
  }
  std::cerr << "   Wanted r" << c.red << ", g" << c.green << ", b" << c.blue
            << "\n";
  std::cerr << "   got    r" << colors[index_of_min].red << ", g"
            << colors[index_of_min].green << ", b" << colors[index_of_min].blue
            << "\n";
  e = color_error(c.red, colors[index_of_min].red, c.green,
                  colors[index_of_min].green, c.blue,
                  colors[index_of_min].blue);
  std::cerr << "  Error = " << e;
  e = color_error(c.red, colors[i].red, c.green, colors[i].green, c.blue,
                  colors[i].blue);
  std::cerr << " error with cell i = " << index_of_min << std::endl;
  if (XAllocColor(screen->display, screen->colormap, &colors[index_of_min]))
    c = colors[index_of_min];
  else
    Paint_It_Black(c, screen->display, screen->colormap);
  delete[] colors;
#endif
}